

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double * dirichlet_sample(int n,double *a,int *seed)

{
  double *a_00;
  ulong uVar1;
  double dVar2;
  
  uVar1 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar1 = (long)n * 8;
  }
  a_00 = (double *)operator_new__(uVar1);
  if (0 < n) {
    uVar1 = 0;
    do {
      dVar2 = gamma_sample(0.0,1.0,a[uVar1],seed);
      a_00[uVar1] = dVar2;
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  r8vec_unit_sum(n,a_00);
  return a_00;
}

Assistant:

double *dirichlet_sample ( int n, double a[], int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_SAMPLE samples the Dirichlet PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Jerry Banks, editor,
//    Handbook of Simulation,
//    Engineering and Management Press Books, 1998, page 169.
//
//  Parameters:
//
//    Input, int N, the number of components.
//
//    Input, double A(N), the probabilities for each component.
//    Each A(I) should be positive.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double DIRICHLET_SAMPLE[N], a sample of the PDF.  The entries
//    of X should sum to 1.
//
{
  double a2;
  double b2;
  double c2;
  int i;
  double *x;

  x = new double[n];

  a2 = 0.0;
  b2 = 1.0;

  for ( i = 0; i < n; i++ )
  {
    c2 = a[i];
    x[i] = gamma_sample ( a2, b2, c2, seed );
  }
//
//  Rescale the vector to have unit sum.
//
  r8vec_unit_sum ( n, x );

  return x;
}